

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O0

void __thiscall LinearExpert::LinearExpert(LinearExpert *this,int d,int D,Z *z,X *x,IMLE *_mixture)

{
  Param *scalar;
  Param *scalar_00;
  Param *matrix;
  Param *pPVar1;
  Matrix<double,__1,__1,_0,__1,__1> *other;
  DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> this_00;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_01;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  undefined8 in_R9;
  Scalar SVar2;
  double dVar3;
  Z sigma0;
  DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffffd68;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_fffffffffffffd70;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffd78;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffd80;
  Index in_stack_fffffffffffffd90;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_02;
  
  *in_RDI = in_ESI;
  in_RDI[1] = in_EDX;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd80);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd80);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffd80);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffd80);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd80);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd80);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd80);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd80);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffd80);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffd80);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd80);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd80);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd80);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd80);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd80);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd80);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd80);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffd80);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffd80);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffd80);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd80);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd80);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffd80);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffd80);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffd80);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffd80);
  this_02 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(in_RDI + 0xaa);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffd80);
  *(undefined8 *)(in_RDI + 0x1e) = in_R9;
  scalar = IMLE::getParameters(*(IMLE **)(in_RDI + 0x1e));
  *(Scal *)(in_RDI + 0x40) = scalar->alpha;
  scalar_00 = IMLE::getParameters(*(IMLE **)(in_RDI + 0x1e));
  *(Scal *)(in_RDI + 0x42) = scalar_00->wPsi;
  matrix = IMLE::getParameters(*(IMLE **)(in_RDI + 0x1e));
  *(Scal *)(in_RDI + 0x44) = matrix->wNu;
  pPVar1 = IMLE::getParameters(*(IMLE **)(in_RDI + 0x1e));
  *(Scal *)(in_RDI + 0x46) = pPVar1->wSigma;
  pPVar1 = IMLE::getParameters(*(IMLE **)(in_RDI + 0x1e));
  *(Scal *)(in_RDI + 0x48) = pPVar1->wLambda;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd70,
             (Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd68);
  *(undefined8 *)(in_RDI + 0x20) = 0x3eb0c6f7a0b5ed8d;
  *(undefined8 *)(in_RDI + 0x22) = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd80,
             (Index)in_stack_fffffffffffffd78);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd80,
             (Index)in_stack_fffffffffffffd78);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffd80
             ,(Index)in_stack_fffffffffffffd78,(Index)in_stack_fffffffffffffd70);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd80,
             (Index)in_stack_fffffffffffffd78);
  other = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setIdentity
                    (in_stack_fffffffffffffd80,(Index)in_stack_fffffffffffffd78,
                     (Index)in_stack_fffffffffffffd70);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pPVar1,(Scalar *)other);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd70,
             (Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd68);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd70,
             (Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd68);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffd80
             ,(Index)in_stack_fffffffffffffd78,(Index)in_stack_fffffffffffffd70);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity
            ((Index)other,in_stack_fffffffffffffd90);
  Eigen::operator*((double *)scalar_00,(StorageBaseType *)matrix);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            (in_stack_fffffffffffffd70,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)in_stack_fffffffffffffd68);
  IMLE::getSigma(*(IMLE **)(in_RDI + 0x1e));
  Eigen::operator*((double *)scalar_00,(StorageBaseType *)matrix);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd70,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_fffffffffffffd68);
  this_00 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::asDiagonal
                      ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                       in_stack_fffffffffffffd68);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            (in_stack_fffffffffffffd70,
             (EigenBase<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
             in_stack_fffffffffffffd68);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::cwiseInverse
            ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00.m_diagonal);
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::asDiagonal((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)in_stack_fffffffffffffd78);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            (in_stack_fffffffffffffd70,
             (EigenBase<Eigen::DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)in_stack_fffffffffffffd68);
  SVar2 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::prod(in_stack_fffffffffffffd78)
  ;
  dVar3 = sqrt(1.0 / SVar2);
  *(double *)(in_RDI + 0x8e) = dVar3;
  this_01 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
            IMLE::getPsi(*(IMLE **)(in_RDI + 0x1e));
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator/(this_02,(double *)scalar);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd70,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)in_stack_fffffffffffffd68);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::cwiseInverse
            ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00.m_diagonal);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68)
  ;
  SVar2 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::prod(this_01);
  dVar3 = sqrt(SVar2);
  *(double *)(in_RDI + 0x90) = dVar3;
  *(undefined1 *)(in_RDI + 0x4a) = 1;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x3045f9);
  return;
}

Assistant:

LINEAR_EXPERT_base::LinearExpert(Z const &z, X const &x, IMLE<d,D,::LinearExpert> *_mixture)
#endif
{
    mixture = _mixture;

    alpha = mixture->getParameters().alpha;
    wPsi = mixture->getParameters().wPsi;
    wNu = mixture->getParameters().wNu;
    wSigma = mixture->getParameters().wSigma;
    wLambda = mixture->getParameters().wLambda;

    Nu0 = z;


    H = EPSILON;

    Sh = 0.0;
    Sz.setZero(d);
    Sx.setZero(D);
    Sxz.setZero(D,d);
    Sxx.setZero(D);
    Szz.setIdentity(d,d) *= EPSILON;


    Nu = z;
    Mu = x;
    Lambda.setZero(D,d);
    varLambda = 1.0/wLambda * ZZ::Identity(d,d);

    Z sigma0 = wSigma/(wSigma+d+2.0)*mixture->getSigma();
    Sigma = sigma0.asDiagonal();
    invSigma = sigma0.cwiseInverse().asDiagonal();
    sqrtDetInvSigma = sqrt( 1.0 / sigma0.prod() );
//    Sigma.setIdentity(d,d) *=  wSigma*mixture->sigma/(wSigma+d+2.0);
//    invSigma.setIdentity(d,d) *=  (wSigma+d+2.0)/(wSigma*mixture->sigma);
//    sqrtDetInvSigma = pow((wSigma+d+2.0)/(wSigma*mixture->sigma), d/2.0);
    Psi = mixture->getPsi() / (1.0 + 2.0/wPsi) ;
    invPsi = Psi.cwiseInverse();
    sqrtDetInvPsi = sqrt(invPsi.prod());


    recompute = true;
}